

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O0

void do_macro(int *ip)

{
  int iVar1;
  ushort **ppuVar2;
  int *ip_local;
  
  if (pass == 1) {
    println();
  }
  else {
    if (expand_macro != 0) {
      error("Can not nest macro definitions!");
      return;
    }
    if (lablptr == (t_symbol *)0x0) {
      while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)prlnbuf[*ip]] & 0x2000) != 0) {
        *ip = *ip + 1;
      }
      iVar1 = colsym(ip);
      if (iVar1 == 0) {
        error("No name for this macro!");
        return;
      }
      lablptr = stlook(1);
      if (lablptr == (t_symbol *)0x0) {
        return;
      }
    }
    if (lablptr->refcnt != 0) {
      if (lablptr->type == 5) {
        fatal_error("Macro already defined!");
        return;
      }
      if (lablptr->type != 6) {
        fatal_error("Symbol already used by a label!");
        return;
      }
      fatal_error("Symbol already used by a function!");
      return;
    }
    iVar1 = check_eol(ip);
    if (iVar1 == 0) {
      return;
    }
    iVar1 = macro_install();
    if (iVar1 == 0) {
      return;
    }
  }
  in_macro = 1;
  return;
}

Assistant:

void
do_macro(int *ip)
{
	if (pass == LAST_PASS)
		println();
	else {
		/* error checking */
		if (expand_macro) {
			error("Can not nest macro definitions!");
			return;
		}
		if (lablptr == NULL) {
			/* skip spaces */
			while (isspace(prlnbuf[*ip]))
				(*ip)++;

			/* search a label after the .macro */
			if (colsym(ip) == 0) {
				error("No name for this macro!");
				return;
			}

			/* put the macro name in the symbol table */
			if ((lablptr = stlook(1)) == NULL)
				return;
		}
		if (lablptr->refcnt) {
			switch (lablptr->type) {
			case MACRO:
				fatal_error("Macro already defined!");
				return;

			case FUNC:
				fatal_error("Symbol already used by a function!");
				return;

			default:
				fatal_error("Symbol already used by a label!");
				return;
			}
		}
		if (!check_eol(ip))
			return;

		/* install this new macro in the hash table */
		if (!macro_install())
			return;
	}
	in_macro = 1;
}